

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFModelExport.cpp
# Opt level: O0

bool iDynTree::exportSolidShape
               (SolidShape *solidShape,exportSolidShapePropertyType type,xmlNodePtr parent_element)

{
  byte bVar1;
  undefined8 uVar2;
  string *psVar3;
  undefined8 uVar4;
  ostream *poVar5;
  char *pcVar6;
  undefined8 in_RDX;
  int in_ESI;
  xmlNodePtr texture_xml;
  string material_str;
  xmlNodePtr color_xml;
  xmlNodePtr material_xml;
  Material material;
  string scale_str;
  xmlNodePtr mesh_xml;
  ExternalMesh *mesh;
  string radius_str_1;
  xmlNodePtr sphere_xml;
  Sphere *sphere;
  string length_str;
  string radius_str;
  xmlNodePtr cylinder_xml;
  Cylinder *cylinder;
  string size_str;
  double size_data [3];
  xmlNodePtr box_xml;
  Box *box;
  xmlNodePtr geometry_xml;
  string shapeName;
  xmlNodePtr root_shape_xml;
  string element_name;
  bool ok;
  Material *in_stack_fffffffffffffb60;
  double *in_stack_fffffffffffffb68;
  undefined7 in_stack_fffffffffffffb70;
  undefined1 in_stack_fffffffffffffb77;
  Material *in_stack_fffffffffffffb78;
  undefined6 in_stack_fffffffffffffb80;
  undefined1 in_stack_fffffffffffffb86;
  undefined1 in_stack_fffffffffffffb87;
  bool bVar7;
  double *in_stack_fffffffffffffb88;
  bool local_411;
  xmlNodePtr in_stack_fffffffffffffc08;
  undefined7 in_stack_fffffffffffffc10;
  undefined1 in_stack_fffffffffffffc17;
  bool local_3c9;
  bool local_391;
  bool local_371;
  bool local_349;
  bool local_2e9;
  string local_2c0 [8];
  string *in_stack_fffffffffffffd48;
  VectorFixSize<3U> *in_stack_fffffffffffffd50;
  string *in_stack_fffffffffffffd68;
  VectorFixSize<4U> *in_stack_fffffffffffffd70;
  string local_278 [32];
  undefined8 local_258;
  string local_250 [32];
  undefined8 local_230;
  undefined4 local_1bc;
  string local_1b8 [32];
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  string local_180 [32];
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  string local_148 [32];
  undefined8 local_128;
  string local_120 [32];
  undefined8 local_100;
  undefined8 local_f8;
  string local_d8 [32];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  string local_80 [32];
  undefined8 local_60;
  string local_48 [39];
  bool local_21;
  undefined8 local_20;
  int local_14;
  byte local_1;
  
  local_21 = true;
  local_20 = in_RDX;
  local_14 = in_ESI;
  std::__cxx11::string::string(local_48);
  if (local_14 == 0) {
    std::__cxx11::string::operator=(local_48,"visual");
  }
  else {
    std::__cxx11::string::operator=(local_48,"collision");
  }
  uVar2 = std::__cxx11::string::c_str();
  local_60 = xmlNewChild(local_20,0,uVar2);
  bVar1 = iDynTree::SolidShape::isNameValid();
  if ((bVar1 & 1) != 0) {
    psVar3 = (string *)iDynTree::SolidShape::getName_abi_cxx11_();
    std::__cxx11::string::string(local_80,psVar3);
    uVar2 = local_60;
    uVar4 = std::__cxx11::string::c_str();
    xmlNewProp(uVar2,"name",uVar4);
    std::__cxx11::string::~string(local_80);
  }
  local_2e9 = false;
  if ((local_21 & 1U) != 0) {
    iDynTree::SolidShape::getLink_H_geometry();
    local_2e9 = exportTransform((Transform *)
                                CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                                in_stack_fffffffffffffc08);
  }
  local_21 = local_2e9;
  local_88 = xmlNewChild(local_60,0,"geometry");
  bVar1 = iDynTree::SolidShape::isBox();
  if ((bVar1 & 1) == 0) {
    bVar1 = iDynTree::SolidShape::isCylinder();
    if ((bVar1 & 1) == 0) {
      bVar1 = iDynTree::SolidShape::isSphere();
      if ((bVar1 & 1) == 0) {
        bVar1 = iDynTree::SolidShape::isExternalMesh();
        if ((bVar1 & 1) == 0) {
          poVar5 = std::operator<<((ostream *)&std::cerr,
                                   "[ERROR] URDFModelExport: Impossible to convert geometry of type "
                                  );
          pcVar6 = std::type_info::name((type_info *)&SolidShape_const*::typeinfo);
          poVar5 = std::operator<<(poVar5,pcVar6);
          poVar5 = std::operator<<(poVar5," to a URDF geometry.");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          local_1 = 0;
          goto LAB_0018ef80;
        }
        local_190 = iDynTree::SolidShape::asExternalMesh();
        uVar2 = xmlNewChild(local_88,0,"mesh");
        local_198 = uVar2;
        iDynTree::ExternalMesh::getFilename_abi_cxx11_();
        uVar4 = std::__cxx11::string::c_str();
        xmlNewProp(uVar2,"filename",uVar4);
        std::__cxx11::string::string(local_1b8);
        local_411 = false;
        if ((local_21 & 1U) != 0) {
          iDynTree::ExternalMesh::getScale();
          local_411 = vectorToString<iDynTree::VectorFixSize<3u>>
                                (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
        }
        uVar2 = local_198;
        local_21 = local_411;
        uVar4 = std::__cxx11::string::c_str();
        xmlNewProp(uVar2,"scale",uVar4);
        std::__cxx11::string::~string(local_1b8);
      }
      else {
        local_158 = iDynTree::SolidShape::asSphere();
        local_160 = xmlNewChild(local_88,0,"sphere");
        std::__cxx11::string::string(local_180);
        local_3c9 = false;
        if ((local_21 & 1U) != 0) {
          local_188 = iDynTree::Sphere::getRadius();
          local_3c9 = doubleToStringWithClassicLocale
                                (in_stack_fffffffffffffb88,
                                 (string *)
                                 CONCAT17(in_stack_fffffffffffffb87,
                                          CONCAT16(in_stack_fffffffffffffb86,
                                                   in_stack_fffffffffffffb80)));
        }
        uVar2 = local_160;
        local_21 = local_3c9;
        uVar4 = std::__cxx11::string::c_str();
        xmlNewProp(uVar2,"radius",uVar4);
        std::__cxx11::string::~string(local_180);
      }
    }
    else {
      local_f8 = iDynTree::SolidShape::asCylinder();
      local_100 = xmlNewChild(local_88,0,"cylinder");
      std::__cxx11::string::string(local_120);
      local_371 = false;
      if ((local_21 & 1U) != 0) {
        local_128 = iDynTree::Cylinder::getRadius();
        local_371 = doubleToStringWithClassicLocale
                              (in_stack_fffffffffffffb88,
                               (string *)
                               CONCAT17(in_stack_fffffffffffffb87,
                                        CONCAT16(in_stack_fffffffffffffb86,in_stack_fffffffffffffb80
                                                )));
      }
      uVar2 = local_100;
      local_21 = local_371;
      uVar4 = std::__cxx11::string::c_str();
      xmlNewProp(uVar2,"radius",uVar4);
      std::__cxx11::string::string(local_148);
      local_391 = false;
      if ((local_21 & 1U) != 0) {
        local_150 = iDynTree::Cylinder::getLength();
        local_391 = doubleToStringWithClassicLocale
                              (in_stack_fffffffffffffb88,
                               (string *)
                               CONCAT17(in_stack_fffffffffffffb87,
                                        CONCAT16(in_stack_fffffffffffffb86,in_stack_fffffffffffffb80
                                                )));
      }
      uVar2 = local_100;
      local_21 = local_391;
      uVar4 = std::__cxx11::string::c_str();
      xmlNewProp(uVar2,"length",uVar4);
      std::__cxx11::string::~string(local_148);
      std::__cxx11::string::~string(local_120);
    }
  }
  else {
    local_90 = iDynTree::SolidShape::asBox();
    local_98 = xmlNewChild(local_88,0,"box");
    local_b8 = iDynTree::Box::getX();
    local_b0 = iDynTree::Box::getY();
    local_a8 = iDynTree::Box::getZ();
    std::__cxx11::string::string(local_d8);
    local_349 = false;
    if ((local_21 & 1U) != 0) {
      VectorFixSize<3U>::VectorFixSize
                ((VectorFixSize<3U> *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                 in_stack_fffffffffffffb68,(size_t)in_stack_fffffffffffffb60);
      local_349 = vectorToString<iDynTree::VectorFixSize<3u>>
                            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    }
    uVar2 = local_98;
    local_21 = local_349;
    uVar4 = std::__cxx11::string::c_str();
    xmlNewProp(uVar2,"size",uVar4);
    std::__cxx11::string::~string(local_d8);
  }
  bVar1 = iDynTree::SolidShape::isMaterialSet();
  if ((bVar1 & 1) != 0) {
    iDynTree::SolidShape::getMaterial();
    Material::Material((Material *)
                       CONCAT17(in_stack_fffffffffffffb87,
                                CONCAT16(in_stack_fffffffffffffb86,in_stack_fffffffffffffb80)),
                       in_stack_fffffffffffffb78);
    uVar2 = xmlNewChild(local_60,0,"material");
    local_230 = uVar2;
    iDynTree::Material::name_abi_cxx11_();
    uVar4 = std::__cxx11::string::c_str();
    xmlNewProp(uVar2,"name",uVar4);
    std::__cxx11::string::~string(local_250);
    bVar1 = iDynTree::Material::hasColor();
    if ((bVar1 & 1) != 0) {
      local_258 = xmlNewChild(local_230,0,"color");
      std::__cxx11::string::string(local_278);
      bVar7 = false;
      if ((local_21 & 1U) != 0) {
        iDynTree::Material::color();
        bVar7 = vectorToString<iDynTree::VectorFixSize<4u>>
                          (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      }
      uVar2 = local_258;
      local_21 = bVar7;
      uVar4 = std::__cxx11::string::c_str();
      xmlNewProp(uVar2,"rgba",uVar4);
      std::__cxx11::string::~string(local_278);
    }
    bVar1 = iDynTree::Material::hasTexture();
    if ((bVar1 & 1) != 0) {
      in_stack_fffffffffffffb60 = (Material *)xmlNewChild(local_230,0,"texture");
      iDynTree::Material::texture_abi_cxx11_();
      uVar2 = std::__cxx11::string::c_str();
      xmlNewProp(in_stack_fffffffffffffb60,"filename",uVar2);
      std::__cxx11::string::~string(local_2c0);
    }
    Material::~Material(in_stack_fffffffffffffb60);
  }
  local_1 = local_21 & 1;
LAB_0018ef80:
  local_1bc = 1;
  std::__cxx11::string::~string(local_48);
  return (bool)(local_1 & 1);
}

Assistant:

bool exportSolidShape(const SolidShape* solidShape, exportSolidShapePropertyType type, xmlNodePtr parent_element)
{
    bool ok=true;
    std::string element_name;
    if (type == VISUAL) {
        element_name = "visual";
    } else {
        // assert(type == COLLISION)
        element_name = "collision";
    }

    xmlNodePtr root_shape_xml = xmlNewChild(parent_element, NULL, BAD_CAST element_name.c_str(), NULL);
    // Omit the name (that is an optional attribute) if the shape has no name
    if (solidShape->isNameValid()) {
        std::string shapeName = solidShape->getName();
        xmlNewProp(root_shape_xml, BAD_CAST "name", BAD_CAST shapeName.c_str());
    }

    // Export transform
    ok = ok && exportTransform(solidShape->getLink_H_geometry(), root_shape_xml);

    // Export geometry
    xmlNodePtr geometry_xml = xmlNewChild(root_shape_xml, NULL, BAD_CAST "geometry", NULL);

    if (solidShape->isBox()) {
        const Box* box = solidShape->asBox();

        // Export box element
        xmlNodePtr box_xml = xmlNewChild(geometry_xml, NULL, BAD_CAST "box", NULL);

        // Export size attribute
        double size_data[3] = {box->getX(), box->getY(), box->getZ()};
        std::string size_str;
        ok = ok && vectorToString(Vector3(size_data, 3) , size_str);
        xmlNewProp(box_xml, BAD_CAST "size", BAD_CAST size_str.c_str());

    } else if (solidShape->isCylinder()) {
        const Cylinder* cylinder = solidShape->asCylinder();

        // Export cylinder element
        xmlNodePtr cylinder_xml = xmlNewChild(geometry_xml, NULL, BAD_CAST "cylinder", NULL);

        // Export radius attribute
        std::string radius_str;
        ok = ok && doubleToStringWithClassicLocale(cylinder->getRadius(), radius_str);
        xmlNewProp(cylinder_xml, BAD_CAST "radius", BAD_CAST radius_str.c_str());

        // Export length attribute
        std::string length_str;
        ok = ok && doubleToStringWithClassicLocale(cylinder->getLength(), length_str);
        xmlNewProp(cylinder_xml, BAD_CAST "length", BAD_CAST length_str.c_str());

    } else if (solidShape->isSphere()) {
        const Sphere* sphere = solidShape->asSphere();

        // Export sphere  element
        xmlNodePtr sphere_xml = xmlNewChild(geometry_xml, NULL, BAD_CAST "sphere", NULL);

        // Export radius attribute
        std::string radius_str;
        ok = ok && doubleToStringWithClassicLocale(sphere->getRadius(), radius_str);
        xmlNewProp(sphere_xml, BAD_CAST "radius", BAD_CAST radius_str.c_str());

    } else if (solidShape->isExternalMesh()) {
        const ExternalMesh* mesh = solidShape->asExternalMesh();

        // Export mesh element
        xmlNodePtr mesh_xml = xmlNewChild(geometry_xml, NULL, BAD_CAST "mesh", NULL);

        // Export filename attribute
        xmlNewProp(mesh_xml, BAD_CAST "filename", BAD_CAST mesh->getFilename().c_str());

        // Export scale attribute
        std::string scale_str;
        ok = ok && vectorToString(mesh->getScale(), scale_str);
        xmlNewProp(mesh_xml, BAD_CAST "scale", BAD_CAST scale_str.c_str());

    } else {
        std::cerr << "[ERROR] URDFModelExport: Impossible to convert geometry of type "
                  <<  typeid(solidShape).name() << " to a URDF geometry." << std::endl;
        return false;
    }

    // Export material if set.
    if (solidShape->isMaterialSet()) {
        auto material = solidShape->getMaterial();
        xmlNodePtr material_xml = xmlNewChild(root_shape_xml, NULL, BAD_CAST "material", NULL);
        xmlNewProp(material_xml, BAD_CAST "name", BAD_CAST material.name().c_str());

        if (material.hasColor()) {
            xmlNodePtr color_xml = xmlNewChild(material_xml, NULL, BAD_CAST "color", NULL);
            std::string material_str;
            ok = ok && vectorToString(material.color(), material_str);
            xmlNewProp(color_xml, BAD_CAST "rgba", BAD_CAST material_str.c_str());
        }
        if (material.hasTexture()) {
            xmlNodePtr texture_xml = xmlNewChild(material_xml, NULL, BAD_CAST "texture", NULL);
            xmlNewProp(texture_xml, BAD_CAST "filename", BAD_CAST material.texture().c_str());
        }
    }

    return ok;
}